

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ShaderBuiltinConstantCase::ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase *this,Context *context,char *name,char *desc,char *varName,
          GetConstantValueFunc getValue,ShaderType shaderType)

{
  allocator<char> local_21;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderBuiltinConstantCase_0212fd40;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_varName,varName,&local_21);
  this->m_getValue = getValue;
  this->m_shaderType = shaderType;
  return;
}

Assistant:

ShaderBuiltinConstantCase::ShaderBuiltinConstantCase (Context& context, const char* name, const char* desc, const char* varName, GetConstantValueFunc getValue, glu::ShaderType shaderType)
	: TestCase		(context, name, desc)
	, m_varName		(varName)
	, m_getValue	(getValue)
	, m_shaderType	(shaderType)
{
}